

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineCacheTests.cpp
# Opt level: O0

void __thiscall
vkt::pipeline::anon_unknown_0::ComputeCacheTestInstance::buildPipeline
          (ComputeCacheTestInstance *this,deUint32 ndx)

{
  RefData<vk::Handle<(vk::HandleType)16>_> data;
  RefData<vk::Handle<(vk::HandleType)18>_> data_00;
  VkPushConstantRange *device;
  DeviceInterface *vk_00;
  Handle<(vk::HandleType)14> *pHVar1;
  Handle<(vk::HandleType)16> *pHVar2;
  Handle<(vk::HandleType)15> *pHVar3;
  Move<vk::Handle<(vk::HandleType)18>_> local_178;
  RefData<vk::Handle<(vk::HandleType)18>_> local_158;
  undefined1 local_138 [8];
  VkComputePipelineCreateInfo pipelineCreateInfo;
  VkPipelineShaderStageCreateInfo stageCreateInfo;
  Move<vk::Handle<(vk::HandleType)16>_> local_98;
  RefData<vk::Handle<(vk::HandleType)16>_> local_78;
  undefined1 local_58 [8];
  VkPipelineLayoutCreateInfo pipelineLayoutCreateInfo;
  VkDevice vkDevice;
  DeviceInterface *vk;
  deUint32 ndx_local;
  ComputeCacheTestInstance *this_local;
  
  vk_00 = Context::getDeviceInterface((this->super_CacheTestInstance).super_TestInstance.m_context);
  pipelineLayoutCreateInfo.pPushConstantRanges =
       (VkPushConstantRange *)
       Context::getDevice((this->super_CacheTestInstance).super_TestInstance.m_context);
  local_58._0_4_ = VK_STRUCTURE_TYPE_PIPELINE_LAYOUT_CREATE_INFO;
  pipelineLayoutCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  pipelineLayoutCreateInfo._4_4_ = 0;
  pipelineLayoutCreateInfo.pNext._0_4_ = 0;
  pipelineLayoutCreateInfo.pNext._4_4_ = 1;
  pipelineLayoutCreateInfo._16_8_ =
       ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::get
                 (&this->m_descriptorSetLayout[ndx].super_RefBase<vk::Handle<(vk::HandleType)19>_>);
  pipelineLayoutCreateInfo.pSetLayouts._0_4_ = 0;
  pipelineLayoutCreateInfo.pushConstantRangeCount = 0;
  pipelineLayoutCreateInfo._36_4_ = 0;
  ::vk::createPipelineLayout
            (&local_98,vk_00,(VkDevice)pipelineLayoutCreateInfo.pPushConstantRanges,
             (VkPipelineLayoutCreateInfo *)local_58,(VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_78,(Move *)&local_98);
  data.deleter.m_deviceIface = local_78.deleter.m_deviceIface;
  data.object.m_internal = local_78.object.m_internal;
  data.deleter.m_device = local_78.deleter.m_device;
  data.deleter.m_allocator = local_78.deleter.m_allocator;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)16>_>::operator=
            (this->m_pipelineLayout + ndx,data);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)16>_>::~Move(&local_98);
  pipelineCreateInfo.basePipelineIndex = 0x12;
  pHVar1 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::operator*
                     (&(this->m_computeShaderModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>)
  ;
  pipelineCreateInfo.stage._16_8_ = pHVar1->m_internal;
  local_138._0_4_ = VK_STRUCTURE_TYPE_COMPUTE_PIPELINE_CREATE_INFO;
  pipelineCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  pipelineCreateInfo._4_4_ = 0;
  pipelineCreateInfo.pNext._0_4_ = 0;
  pipelineCreateInfo._20_4_ = pipelineCreateInfo._92_4_;
  pipelineCreateInfo.flags = pipelineCreateInfo.basePipelineIndex;
  pipelineCreateInfo.stage.pNext = (void *)0x2000000000;
  pipelineCreateInfo.stage.module.m_internal = (long)"pre_main" + 4;
  pipelineCreateInfo.stage.pName = (char *)0x0;
  pipelineCreateInfo.stage.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  pipelineCreateInfo.stage._4_4_ = 0;
  pHVar2 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::operator*
                     (&this->m_pipelineLayout[ndx].super_RefBase<vk::Handle<(vk::HandleType)16>_>);
  pipelineCreateInfo.stage.pSpecializationInfo = (VkSpecializationInfo *)pHVar2->m_internal;
  ::vk::Handle<(vk::HandleType)18>::Handle
            ((Handle<(vk::HandleType)18> *)&pipelineCreateInfo.layout,0);
  device = pipelineLayoutCreateInfo.pPushConstantRanges;
  pipelineCreateInfo.basePipelineHandle.m_internal._0_4_ = 0;
  pHVar3 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)15>_>::operator*
                     (&(this->super_CacheTestInstance).m_cache.
                       super_RefBase<vk::Handle<(vk::HandleType)15>_>);
  ::vk::createComputePipeline
            (&local_178,vk_00,(VkDevice)device,(VkPipelineCache)pHVar3->m_internal,
             (VkComputePipelineCreateInfo *)local_138,(VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_158,(Move *)&local_178);
  data_00.deleter.m_deviceIface = local_158.deleter.m_deviceIface;
  data_00.object.m_internal = local_158.object.m_internal;
  data_00.deleter.m_device = local_158.deleter.m_device;
  data_00.deleter.m_allocator = local_158.deleter.m_allocator;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>::operator=(this->m_pipeline + ndx,data_00)
  ;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>::~Move(&local_178);
  return;
}

Assistant:

void ComputeCacheTestInstance::buildPipeline (deUint32 ndx)
{
	const DeviceInterface&  vk               = m_context.getDeviceInterface();
	const VkDevice          vkDevice         = m_context.getDevice();

	// Create compute pipeline layout
	const VkPipelineLayoutCreateInfo pipelineLayoutCreateInfo =
	{
		VK_STRUCTURE_TYPE_PIPELINE_LAYOUT_CREATE_INFO,  // VkStructureType                 sType;
		DE_NULL,                                        // const void*                     pNext;
		0u,                                             // VkPipelineLayoutCreateFlags     flags;
		1u,                                             // deUint32                        setLayoutCount;
		&m_descriptorSetLayout[ndx].get(),              // const VkDescriptorSetLayout*    pSetLayouts;
		0u,                                             // deUint32                        pushConstantRangeCount;
		DE_NULL,                                        // const VkPushConstantRange*      pPushConstantRanges;
	};

	m_pipelineLayout[ndx] = createPipelineLayout(vk, vkDevice, &pipelineLayoutCreateInfo);

	const VkPipelineShaderStageCreateInfo stageCreateInfo =
	{
		VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO, // VkStructureType                     sType;
		DE_NULL,                                             // const void*                         pNext;
		0u,                                                  // VkPipelineShaderStageCreateFlags    flags;
		VK_SHADER_STAGE_COMPUTE_BIT,                         // VkShaderStageFlagBits               stage;
		*m_computeShaderModule,                              // VkShaderModule                      module;
		"main",                                              // const char*                         pName;
		DE_NULL,                                             // const VkSpecializationInfo*         pSpecializationInfo;
	};

	const VkComputePipelineCreateInfo pipelineCreateInfo =
	{
		VK_STRUCTURE_TYPE_COMPUTE_PIPELINE_CREATE_INFO,      // VkStructureType                 sType;
		DE_NULL,                                             // const void*                     pNext;
		0u,                                                  // VkPipelineCreateFlags           flags;
		stageCreateInfo,                                     // VkPipelineShaderStageCreateInfo stage;
		*m_pipelineLayout[ndx],                              // VkPipelineLayout                layout;
		(VkPipeline)0,                                       // VkPipeline                      basePipelineHandle;
		0u,                                                  // deInt32                         basePipelineIndex;
	};

	m_pipeline[ndx] = createComputePipeline(vk, vkDevice, *m_cache, &pipelineCreateInfo);
}